

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JointElement.cpp
# Opt level: O1

void __thiscall iDynTree::JointElement::exitElementScope(JointElement *this)

{
  string *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  element_type *peVar3;
  undefined8 uVar4;
  int iVar5;
  RevoluteJoint *this_00;
  long *plVar6;
  PrismaticJoint *this_01;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  __hashtable *__h;
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,iDynTree::JointElement::JointInfo>,std::allocator<std::pair<std::__cxx11::string_const,iDynTree::JointElement::JointInfo>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  *p_Var8;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::JointElement::JointInfo>,_false,_true>,_bool>
  pVar9;
  string errStr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::JointElement::JointInfo>
  local_158;
  undefined1 local_b8 [64];
  _Alloc_hider local_78;
  size_type local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  _Alloc_hider local_58;
  size_type local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  
  local_b8._0_8_ = (element_type *)0x0;
  local_b8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  iDynTree::Position::Position((Position *)(local_b8 + 0x28));
  uVar4 = local_b8._8_8_;
  local_70 = 0;
  local_68._M_local_buf[0] = '\0';
  local_50 = 0;
  local_48._M_local_buf[0] = '\0';
  local_b8._0_8_ = (RevoluteJoint *)0x0;
  local_b8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_78._M_p = (pointer)&local_68;
  local_58._M_p = (pointer)&local_48;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar4 !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar4);
  }
  psVar1 = &this->m_jointType;
  iVar5 = std::__cxx11::string::compare((char *)psVar1);
  if (iVar5 == 0) {
    local_158.first._M_dataplus._M_p = (pointer)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<iDynTree::FixedJoint,std::allocator<iDynTree::FixedJoint>,iDynTree::Transform&>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_158.first._M_string_length,
               (FixedJoint **)&local_158,(allocator<iDynTree::FixedJoint> *)&local_178,
               &this->m_jointFrame);
    uVar4 = local_b8._8_8_;
    local_b8._8_8_ = local_158.first._M_string_length;
    local_b8._0_8_ = local_158.first._M_dataplus._M_p;
    local_158.first._M_dataplus._M_p = (pointer)0x0;
    local_158.first._M_string_length = 0;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar4 !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar4);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158.first._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158.first._M_string_length);
    }
    p_Var8 = (_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,iDynTree::JointElement::JointInfo>,std::allocator<std::pair<std::__cxx11::string_const,iDynTree::JointElement::JointInfo>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)this->m_fixedJoints;
  }
  else {
    iVar5 = std::__cxx11::string::compare((char *)psVar1);
    if (iVar5 == 0) {
LAB_0012dac0:
      this_00 = (RevoluteJoint *)operator_new(0x218);
      iDynTree::RevoluteJoint::RevoluteJoint(this_00);
      (**(code **)(*(long *)this_00 + 0x30))(this_00,&this->m_jointFrame);
      local_158.first._M_dataplus._M_p = (pointer)this_00;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<iDynTree::RevoluteJoint*>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_158.first._M_string_length,
                 this_00);
    }
    else {
      iVar5 = std::__cxx11::string::compare((char *)psVar1);
      if (iVar5 == 0) goto LAB_0012dac0;
      iVar5 = std::__cxx11::string::compare((char *)psVar1);
      if (iVar5 != 0) {
        p_Var8 = (_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,iDynTree::JointElement::JointInfo>,std::allocator<std::pair<std::__cxx11::string_const,iDynTree::JointElement::JointInfo>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)0x0;
        goto LAB_0012db87;
      }
      this_01 = (PrismaticJoint *)operator_new(0x218);
      iDynTree::PrismaticJoint::PrismaticJoint(this_01);
      (**(code **)(*(long *)this_01 + 0x30))(this_01,&this->m_jointFrame);
      local_158.first._M_dataplus._M_p = (pointer)this_01;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<iDynTree::PrismaticJoint*>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_158.first._M_string_length,
                 this_01);
    }
    uVar4 = local_b8._8_8_;
    local_b8._8_8_ = local_158.first._M_string_length;
    local_b8._0_8_ = local_158.first._M_dataplus._M_p;
    local_158.first._M_dataplus._M_p = (pointer)0x0;
    local_158.first._M_string_length = 0;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar4 !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar4);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158.first._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158.first._M_string_length);
    }
    p_Var8 = (_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,iDynTree::JointElement::JointInfo>,std::allocator<std::pair<std::__cxx11::string_const,iDynTree::JointElement::JointInfo>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)this->m_joints;
  }
LAB_0012db87:
  if (p_Var8 == (_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,iDynTree::JointElement::JointInfo>,std::allocator<std::pair<std::__cxx11::string_const,iDynTree::JointElement::JointInfo>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                 *)0x0 || (RevoluteJoint *)local_b8._0_8_ == (RevoluteJoint *)0x0)
  goto LAB_0012de61;
  std::__cxx11::string::_M_assign((string *)&local_78);
  std::__cxx11::string::_M_assign((string *)&local_58);
  iDynTree::Axis::operator=((Axis *)(local_b8 + 0x10),&this->m_axis);
  if ((this->m_limits).
      super___shared_ptr<iDynTree::JointElement::Limits,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    iVar5 = std::__cxx11::string::compare((char *)psVar1);
    if (iVar5 != 0) {
      iVar5 = std::__cxx11::string::compare((char *)psVar1);
      if (iVar5 != 0) goto LAB_0012dc27;
    }
    std::operator+(&local_178,"Joint ",&this->m_jointName);
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_178);
    paVar2 = &local_158.first.field_2;
    paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 == paVar7) {
      local_158.first.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
      local_158.first.field_2._8_8_ = plVar6[3];
      local_158.first._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_158.first.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
      local_158.first._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_158.first._M_string_length = plVar6[1];
    *plVar6 = (long)paVar7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178._M_dataplus._M_p != &local_178.field_2) {
      operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
    }
    iDynTree::reportWarning("JointElement","",local_158.first._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158.first._M_dataplus._M_p != paVar2) {
      operator_delete(local_158.first._M_dataplus._M_p,
                      local_158.first.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    (**(code **)(*(long *)local_b8._0_8_ + 0xd0))(local_b8._0_8_,1);
    peVar3 = (this->m_limits).
             super___shared_ptr<iDynTree::JointElement::Limits,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (**(code **)(*(long *)local_b8._0_8_ + 0xf0))
              (SUB84(peVar3->positionLower,0),SUB84(peVar3->positionUpper,0),local_b8._0_8_,0);
  }
LAB_0012dc27:
  if ((this->m_dynamic_params).
      super___shared_ptr<iDynTree::JointElement::JointDynamicsParams,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr != (element_type *)0x0) {
    (**(code **)(*(long *)local_b8._0_8_ + 0x100))(local_b8._0_8_,1);
    (**(code **)(*(long *)local_b8._0_8_ + 0x108))
              (SUB84(((this->m_dynamic_params).
                      super___shared_ptr<iDynTree::JointElement::JointDynamicsParams,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr)->damping,0),local_b8._0_8_,0);
    (**(code **)(*(long *)local_b8._0_8_ + 0x110))
              (SUB84(((this->m_dynamic_params).
                      super___shared_ptr<iDynTree::JointElement::JointDynamicsParams,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr)->staticFriction,0),local_b8._0_8_,0);
  }
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::JointElement::JointInfo>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_iDynTree::JointElement::JointInfo_&,_true>
            (&local_158,&this->m_jointName,(JointInfo *)local_b8);
  pVar9 = std::
          _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,iDynTree::JointElement::JointInfo>,std::allocator<std::pair<std::__cxx11::string_const,iDynTree::JointElement::JointInfo>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
          ::_M_emplace<std::pair<std::__cxx11::string_const,iDynTree::JointElement::JointInfo>>
                    (p_Var8,&local_158);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158.second.childLinkName._M_dataplus._M_p != &local_158.second.childLinkName.field_2)
  {
    operator_delete(local_158.second.childLinkName._M_dataplus._M_p,
                    local_158.second.childLinkName.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158.second.parentLinkName._M_dataplus._M_p !=
      &local_158.second.parentLinkName.field_2) {
    operator_delete(local_158.second.parentLinkName._M_dataplus._M_p,
                    local_158.second.parentLinkName.field_2._M_allocated_capacity + 1);
  }
  if (local_158.second.joint.super___shared_ptr<iDynTree::IJoint,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_158.second.joint.
               super___shared_ptr<iDynTree::IJoint,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  paVar2 = &local_158.first.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_158.first._M_dataplus._M_p,
                    local_158.first.field_2._M_allocated_capacity + 1);
  }
  if (((undefined1  [16])pVar9 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    std::operator+(&local_178,"Duplicate joint ",&this->m_jointName);
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_178);
    paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 == paVar7) {
      local_158.first.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
      local_158.first.field_2._8_8_ = plVar6[3];
      local_158.first._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_158.first.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
      local_158.first._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_158.first._M_string_length = plVar6[1];
    *plVar6 = (long)paVar7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178._M_dataplus._M_p != &local_178.field_2) {
      operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
    }
    iDynTree::reportError("JointElement","",local_158.first._M_dataplus._M_p);
    iDynTree::XMLElement::getParserState();
    iDynTree::XMLParserState::setParsingError();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158.first._M_dataplus._M_p != paVar2) {
      operator_delete(local_158.first._M_dataplus._M_p,
                      local_158.first.field_2._M_allocated_capacity + 1);
    }
  }
LAB_0012de61:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_p != &local_48) {
    operator_delete(local_58._M_p,
                    CONCAT71(local_48._M_allocated_capacity._1_7_,local_48._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_p != &local_68) {
    operator_delete(local_78._M_p,
                    CONCAT71(local_68._M_allocated_capacity._1_7_,local_68._M_local_buf[0]) + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_);
  }
  return;
}

Assistant:

void JointElement::exitElementScope()
    {
        JointElement::JointInfo info;
        info.joint = nullptr;
        std::unordered_map<std::string, JointElement::JointInfo>* map = nullptr;
        
        if (m_jointType == "fixed")
        {
            info.joint = std::make_shared<FixedJoint>(m_jointFrame);
            map = &m_fixedJoints;
        }
        else if (m_jointType == "revolute" || m_jointType == "continuous")
        {
            RevoluteJoint* rev_joint = new RevoluteJoint();
            rev_joint->setRestTransform(m_jointFrame);
            info.joint = std::shared_ptr<IJoint>(rev_joint);
            map = &m_joints;
        }
        else if (m_jointType == "prismatic")
        {
            PrismaticJoint* prism_joint = new PrismaticJoint();
            prism_joint->setRestTransform(m_jointFrame);
            info.joint = std::shared_ptr<IJoint>(prism_joint);
            map = &m_joints;
        }

        if (info.joint && map) {
            info.parentLinkName = m_parentLink;
            info.childLinkName = m_childLink;
            info.axis = m_axis;

            if (m_limits) {
                // Limits found
                info.joint->enablePosLimits(true);
                info.joint->setPosLimits(0, m_limits->positionLower, m_limits->positionUpper);
            } else if (m_jointType == "revolute" || m_jointType == "prismatic") {
                std::string errStr = "Joint " + m_jointName + " misses the limit tag.";
                reportWarning("JointElement", "", errStr.c_str());
            }

            if(m_dynamic_params) {
                info.joint->setJointDynamicsType(URDFJointDynamics);
                info.joint->setDamping(0, m_dynamic_params->damping);
                info.joint->setStaticFriction(0, m_dynamic_params->staticFriction);
            }

            if (!map->insert(std::unordered_map<std::string, JointElement::JointInfo>::value_type(m_jointName, info)).second) {
                std::string errStr = "Duplicate joint " + m_jointName + " found.";
                reportError("JointElement", "", errStr.c_str());
                getParserState().setParsingError();
            }
        }
    }